

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  environment env;
  int argc_1;
  Session session;
  undefined1 auStack_1a8 [4];
  undefined4 local_1a4;
  Session local_1a0;
  
  local_1a4 = 0;
  local_1a0.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
  MPI_Init_thread(&local_1a4,&local_1a0,1,auStack_1a8);
  Catch::Session::Session(&local_1a0);
  iVar1 = Catch::Session::run<char>(&local_1a0,argc,argv);
  Catch::Session::~Session(&local_1a0);
  MPI_Finalize();
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
  diy::mpi::environment env;

  Catch::Session session;
  return session.run(argc, argv);
}